

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O0

MVOverEl<double> * __thiscall
mp::pre::ValuePresolver::PresolveSolution
          (ValuePresolver *this,MVOverEl<double> *mv,ValueResolution param_3)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  reference pvVar1;
  const_reference pvVar2;
  size_type __n;
  long in_RSI;
  ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_> *in_RDI;
  ValueMap<std::vector<double,_std::allocator<double>_>,_int> *in_stack_00000020;
  size_type i;
  VarBndVec *ubs;
  VarBndVec *lbs;
  vector<double,_std::allocator<double>_> *x;
  MVOverEl<double> *result;
  value_type vVar3;
  undefined8 in_stack_ffffffffffffff68;
  MVOverEl<double> *in_stack_ffffffffffffff70;
  ValuePresolverImpl *in_stack_ffffffffffffff78;
  undefined8 local_50;
  
  ValuePresolverImpl::PresolveSolution
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (ValueResolution)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_>::GetVarValues
            (in_RDI);
  this_00 = ValueMap<std::vector<double,_std::allocator<double>_>,_int>::operator()
                      (in_stack_00000020);
  this_01 = (vector<double,_std::allocator<double>_> *)
            (**(code **)(**(long **)(in_RSI + 0x338) + 0x10))();
  this_02 = (vector<double,_std::allocator<double>_> *)
            (**(code **)(**(long **)(in_RSI + 0x338) + 0x18))();
  local_50 = std::vector<double,_std::allocator<double>_>::size(this_00);
  while (__n = local_50 - 1, local_50 != 0) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,__n);
    vVar3 = *pvVar1;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_01,__n);
    local_50 = __n;
    if (*pvVar2 <= vVar3) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,__n);
      vVar3 = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_02,__n);
      if (*pvVar2 <= vVar3 && vVar3 != *pvVar2) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_02,__n);
        vVar3 = *pvVar2;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,__n);
        *pvVar1 = vVar3;
      }
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_01,__n);
      vVar3 = *pvVar2;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,__n);
      *pvVar1 = vVar3;
    }
  }
  return in_RDI;
}

Assistant:

MVOverEl<double> PresolveSolution (
      const MVOverEl<double>& mv,
      ValueResolution  = ValueResolution::ValResLast) override {
    auto result = ValuePresolverImpl::PresolveSolution(
        mv, ValueResolution::ValResLast);
    auto& x = result.GetVarValues()();
    const auto& lbs = model_.GetVarLBs();
    const auto& ubs = model_.GetVarUBs();
    assert(x.size() == lbs.size());
    assert(lbs.size() == ubs.size());
    for (auto i=x.size(); i--; ) {
      if (x[i]<lbs[i])
        x[i]=lbs[i];
      else
        if (x[i]>ubs[i])
          x[i]=ubs[i];
    }
    return result;
  }